

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O3

void anon_unknown.dwarf_33eb38::fillPixelsGray(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  ushort uVar5;
  float fVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  ulong local_50;
  
  if (0 < h) {
    lVar9 = 0;
    local_50 = 0;
    do {
      if (0 < w) {
        uVar10 = 0;
        do {
          lVar8 = pixels->_sizeY;
          pRVar1 = pixels->_data;
          dVar2 = (double)(int)uVar10 * 0.05 + (double)(int)local_50 * -0.05;
          dVar3 = sin(dVar2);
          fVar11 = (float)(dVar3 * 0.5 + 0.8);
          fVar6 = ABS(fVar11);
          uVar5 = (ushort)((uint)fVar11 >> 0x10) & 0x8000;
          if ((uint)fVar6 < 0x38800000) {
            if ((0x33000000 < (uint)fVar6) &&
               (uVar7 = (uint)fVar6 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar6 >> 0x17),
               uVar5 = uVar5 | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
               0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
              uVar5 = uVar5 + 1;
            }
          }
          else if ((uint)fVar6 < 0x7f800000) {
            if ((uint)fVar6 < 0x477ff000) {
              uVar5 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar5;
            }
            else {
              uVar5 = uVar5 | 0x7c00;
            }
          }
          else {
            uVar5 = uVar5 | 0x7c00;
            if (fVar6 != INFINITY) {
              uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
              uVar5 = uVar5 | (ushort)uVar7 | (ushort)(uVar7 == 0);
            }
          }
          lVar8 = lVar8 * lVar9;
          *(ushort *)((long)&pRVar1[uVar10].r._h + lVar8) = uVar5;
          *(ushort *)((long)&pRVar1[uVar10].g._h + lVar8) = uVar5;
          *(ushort *)((long)&pRVar1[uVar10].b._h + lVar8) = uVar5;
          dVar2 = cos(dVar2);
          fVar11 = (float)(dVar2 * 0.5 + 0.5);
          fVar6 = ABS(fVar11);
          uVar5 = (ushort)((uint)fVar11 >> 0x10) & 0x8000;
          if ((uint)fVar6 < 0x38800000) {
            if ((0x33000000 < (uint)fVar6) &&
               (uVar7 = (uint)fVar6 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar6 >> 0x17),
               uVar5 = uVar5 | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
               0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
              uVar5 = uVar5 + 1;
            }
          }
          else if ((uint)fVar6 < 0x7f800000) {
            if ((uint)fVar6 < 0x477ff000) {
              uVar5 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar5;
            }
            else {
              uVar5 = uVar5 | 0x7c00;
            }
          }
          else {
            uVar5 = uVar5 | 0x7c00;
            if (fVar6 != INFINITY) {
              uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
              uVar5 = uVar5 | (ushort)uVar7 | (ushort)(uVar7 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].a._h + lVar8) = uVar5;
          uVar10 = uVar10 + 1;
        } while ((uint)w != uVar10);
      }
      local_50 = local_50 + 1;
      lVar9 = lVar9 + 8;
    } while (local_50 != (uint)h);
  }
  return;
}

Assistant:

void
fillPixelsGray (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);
            p.g = p.r;
            p.b = p.r;
            p.a = 0.5 + 0.5 * cos (x * 0.05 - y * 0.05);
        }
    }
}